

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O1

void EDLines::LineFit(double *x,double *y,int count,double *a,double *b,double *e,int *invert)

{
  double dVar1;
  double *pdVar2;
  ulong uVar3;
  int i;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  if (1 < count) {
    dVar5 = 0.0;
    uVar4 = 0;
    dVar7 = 0.0;
    do {
      dVar5 = dVar5 + x[uVar4];
      dVar7 = dVar7 + y[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uint)count != uVar4);
    dVar6 = (double)count;
    dVar8 = 0.0;
    uVar4 = 0;
    dVar9 = 0.0;
    do {
      dVar10 = x[uVar4] - dVar5 / dVar6;
      dVar8 = dVar8 + dVar10 * dVar10;
      dVar10 = y[uVar4] - dVar7 / dVar6;
      dVar9 = dVar9 + dVar10 * dVar10;
      uVar4 = uVar4 + 1;
    } while ((uint)count != uVar4);
    pdVar2 = x;
    dVar10 = dVar7;
    dVar1 = dVar5;
    if (dVar8 < dVar9) {
      pdVar2 = y;
      dVar10 = dVar5;
      dVar1 = dVar7;
      y = x;
    }
    uVar4 = 1;
    if (1 < count) {
      uVar4 = (ulong)(uint)count;
    }
    *invert = (uint)(dVar8 < dVar9);
    dVar8 = 0.0;
    uVar3 = 0;
    dVar9 = 0.0;
    do {
      dVar11 = pdVar2[uVar3];
      dVar8 = dVar8 + dVar11 * dVar11;
      dVar9 = dVar9 + dVar11 * y[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
    dVar11 = dVar6 * dVar8 - dVar1 * dVar1;
    *a = (dVar10 * dVar8 - dVar9 * dVar1) / dVar11;
    dVar11 = (dVar6 * dVar9 - dVar7 * dVar5) / dVar11;
    *b = dVar11;
    dVar5 = 0.0;
    if ((dVar11 != 0.0) || (NAN(dVar11))) {
      uVar3 = 0;
      do {
        dVar7 = (*a - (-(-1.0 / dVar11) * pdVar2[uVar3] + y[uVar3])) / (-1.0 / dVar11 - dVar11);
        dVar8 = pdVar2[uVar3] - dVar7;
        dVar7 = y[uVar3] - (dVar11 * dVar7 + *a);
        dVar5 = dVar5 + dVar8 * dVar8 + dVar7 * dVar7;
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
      dVar5 = dVar5 / dVar6;
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
    }
    else {
      uVar4 = 1;
      if (1 < count) {
        uVar4 = (ulong)(uint)count;
      }
      uVar3 = 0;
      do {
        dVar5 = dVar5 + ABS(*a - y[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
      dVar5 = dVar5 / dVar6;
    }
    *e = dVar5;
  }
  return;
}

Assistant:

void EDLines::LineFit(double * x, double * y, int count, double &a, double &b, double &e, int &invert)
{
	if (count<2) return;

	double S = count, Sx = 0.0, Sy = 0.0, Sxx = 0.0, Sxy = 0.0;
	for (int i = 0; i<count; i++) {
		Sx += x[i];
		Sy += y[i];
	} //end-for

	double mx = Sx / count;
	double my = Sy / count;

	double dx = 0.0;
	double dy = 0.0;
	for (int i = 0; i < count; i++) {
		dx += (x[i] - mx)*(x[i] - mx);
		dy += (y[i] - my)*(y[i] - my);
	} //end-for

	if (dx < dy) {
		// Vertical line. Swap x & y, Sx & Sy
		invert = 1;
		double *t = x;
		x = y;
		y = t;

		double d = Sx;
		Sx = Sy;
		Sy = d;

	}
	else {
		invert = 0;
	} //end-else  

	  // Now compute Sxx & Sxy
	for (int i = 0; i<count; i++) {
		Sxx += x[i] * x[i];
		Sxy += x[i] * y[i];
	} //end-for

	double D = S*Sxx - Sx*Sx;
	a = (Sxx*Sy - Sx*Sxy) / D;
	b = (S  *Sxy - Sx* Sy) / D;

	if (b == 0.0) {
		// Vertical or horizontal line
		double error = 0.0;
		for (int i = 0; i<count; i++) {
			error += fabs((a) - y[i]);
		} //end-for
		e = error / count;

	}
	else {
		double error = 0.0;
		for (int i = 0; i<count; i++) {
			// Let the line passing through (x[i], y[i]) that is perpendicular to a+bx be c+dx
			double d = -1.0 / (b);
			double c = y[i] - d*x[i];
			double x2 = ((a) - c) / (d - (b));
			double y2 = (a) + (b)*x2;

			double dist = (x[i] - x2)*(x[i] - x2) + (y[i] - y2)*(y[i] - y2);
			error += dist;
		} //end-for

		e = sqrt(error / count);
	} //end-else
}